

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void do_shifti(TCGContext_conflict9 *tcg_ctx,TCGOpcode opc,uint vece,TCGv_vec r,TCGv_vec a,int64_t i
              )

{
  byte bVar1;
  int iVar2;
  
  if (i != 0) {
    bVar1 = ((undefined1 *)((long)&tcg_ctx->pool_cur + 2))[(long)r];
    iVar2 = tcg_can_emit_vec_op_tricore(tcg_ctx,opc,(uint)bVar1,vece);
    if (iVar2 < 1) {
      tcg_expand_vec_op_tricore
                (tcg_ctx,opc,(uint)bVar1,vece,(TCGArg)(r + (long)&tcg_ctx->pool_cur),
                 a + (long)tcg_ctx,i);
    }
    else {
      vec_gen_3_tricore(tcg_ctx,opc,(uint)bVar1,vece,(TCGArg)(r + (long)&tcg_ctx->pool_cur),
                        (TCGArg)(a + (long)tcg_ctx),i);
    }
    return;
  }
  tcg_gen_mov_vec_tricore(tcg_ctx,r,a);
  return;
}

Assistant:

static void do_shifti(TCGContext *tcg_ctx, TCGOpcode opc, unsigned vece,
                      TCGv_vec r, TCGv_vec a, int64_t i)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGType type = rt->base_type;
    int can;

    tcg_debug_assert(at->base_type == type);
    tcg_debug_assert(i >= 0 && i < (8 << vece));
    tcg_assert_listed_vecop(opc);

    if (i == 0) {
        tcg_gen_mov_vec(tcg_ctx, r, a);
        return;
    }

    can = tcg_can_emit_vec_op(tcg_ctx, opc, type, vece);
    if (can > 0) {
        vec_gen_3(tcg_ctx, opc, type, vece, ri, ai, i);
    } else {
        /* We leave the choice of expansion via scalar or vector shift
           to the target.  Often, but not always, dupi can feed a vector
           shift easier than a scalar.  */
        const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);
        tcg_debug_assert(can < 0);
        tcg_expand_vec_op(tcg_ctx, opc, type, vece, ri, ai, i);
        tcg_swap_vecop_list(hold_list);
    }
}